

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  size_t *psVar1;
  uint64_t *puVar2;
  long lVar3;
  byte bVar4;
  _7zip *zip;
  uchar *puVar5;
  lzma_ret lVar6;
  int iVar7;
  Bool BVar8;
  uint uVar9;
  uchar *puVar10;
  uint8_t *__src;
  ssize_t sVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar12;
  void *pvVar13;
  unsigned_long uVar14;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  char *pcVar18;
  uchar *puVar19;
  uint uVar20;
  uchar *puVar21;
  size_t sVar22;
  long lVar23;
  uchar *puVar24;
  ulong uVar25;
  uint64_t uVar26;
  size_t sVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  uchar *puVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  size_t sVar35;
  bool bVar36;
  bool bVar37;
  ulong local_b8;
  int local_b0;
  int local_ac;
  bz_stream *local_a8;
  lzma_stream *local_a0;
  ulong local_98;
  CPpmd7z_RangeDec *local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  uchar *local_68;
  code *local_60;
  IByteIn *local_58;
  z_streamp local_50;
  size_t local_48;
  CPpmd7 *local_40;
  code *local_38;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar13 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_b8);
    if (0 < (long)local_b8 && pvVar13 != (void *)0x0) {
      uVar32 = zip->folder_outbytes_remaining;
      uVar34 = zip->pack_stream_inbytes_remaining;
      if (uVar34 <= local_b8) {
        local_b8 = uVar34;
      }
      zip->pack_stream_inbytes_remaining = uVar34 - local_b8;
      if (uVar32 <= local_b8) {
        local_b8 = uVar32;
      }
      zip->folder_outbytes_remaining = uVar32 - local_b8;
      zip->uncompressed_buffer_bytes_remaining = local_b8;
      return 0;
    }
  }
  else {
    puVar21 = zip->uncompressed_buffer;
    if (puVar21 == (uchar *)0x0) {
      sVar17 = 0x10000;
      if (0x10000 < minimum) {
        sVar17 = minimum + 0x3ff & 0xfffffffffffffc00;
      }
      zip->uncompressed_buffer_size = sVar17;
      puVar21 = (uchar *)malloc(sVar17);
      zip->uncompressed_buffer = puVar21;
      if (puVar21 == (uchar *)0x0) {
LAB_00666885:
        pcVar18 = "No memory for 7-Zip decompression";
        iVar7 = 0xc;
        goto LAB_006673a6;
      }
LAB_006668ca:
      zip->uncompressed_buffer_bytes_remaining = 0;
    }
    else if (zip->uncompressed_buffer_size < minimum) {
      puVar24 = zip->uncompressed_buffer_pointer;
      uVar32 = minimum + 0x3ff & 0xfffffffffffffc00;
      puVar10 = (uchar *)realloc(puVar21,uVar32);
      if (puVar10 == (uchar *)0x0) goto LAB_00666885;
      lVar23 = (long)puVar24 - (long)puVar21;
      if (puVar24 == (uchar *)0x0) {
        lVar23 = 0;
      }
      zip->uncompressed_buffer = puVar10;
      zip->uncompressed_buffer_size = uVar32;
      puVar21 = puVar10;
LAB_006668b1:
      if (lVar23 != 0) {
        memmove(puVar21,puVar21 + lVar23,zip->uncompressed_buffer_bytes_remaining);
      }
    }
    else {
      if (minimum <= zip->uncompressed_buffer_bytes_remaining) goto LAB_006668ca;
      if (zip->uncompressed_buffer_pointer != (uchar *)0x0) {
        lVar23 = (long)zip->uncompressed_buffer_pointer - (long)puVar21;
        goto LAB_006668b1;
      }
    }
    zip->uncompressed_buffer_pointer = (uchar *)0x0;
    local_48 = minimum;
    __src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_b8);
    if (0 < (long)local_b8) {
      local_68 = zip->odd_bcj;
      local_58 = &zip->bytein;
      local_90 = &zip->range_dec;
      local_60 = Ppmd7z_RangeDec_Init;
      local_38 = Ppmd7_DecodeSymbol;
      local_40 = &zip->ppmd7_context;
      local_50 = &zip->stream;
      local_a8 = &zip->bzstream;
      local_a0 = &zip->lzstream;
      do {
        sVar22 = zip->uncompressed_buffer_size;
        sVar12 = zip->uncompressed_buffer_bytes_remaining;
        puVar21 = zip->uncompressed_buffer + sVar12;
        uVar33 = sVar22 - sVar12;
        uVar32 = zip->pack_stream_inbytes_remaining;
        uVar34 = local_b8;
        if (uVar32 <= local_b8) {
          uVar34 = uVar32;
        }
        uVar14 = zip->codec2;
        sVar27 = uVar33;
        puVar24 = puVar21;
        if (uVar14 != 0x3030103 || zip->codec == 0x21) {
LAB_00666a99:
          sVar22 = sVar27;
          puVar10 = puVar24;
          if (uVar14 == 0x303011b) {
            sVar12 = zip->tmp_stream_bytes_remaining;
            if (sVar12 == 0) {
LAB_00666b1f:
              sVar27 = zip->tmp_stream_buff_size;
              puVar10 = zip->tmp_stream_buff;
              goto LAB_00666b35;
            }
            sVar11 = Bcj2_Decode(zip,puVar24,sVar27);
            if (-1 < sVar11) {
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar12);
              sVar22 = sVar27 - sVar11;
              if ((uVar32 == 0) || (sVar22 == 0)) {
                uVar25 = uVar33 - sVar22;
                uVar9 = 0;
                if (uVar32 == 0) {
                  uVar9 = (uint)(zip->tmp_stream_bytes_remaining != 0);
                }
                goto LAB_00666c7a;
              }
              puVar24 = puVar24 + sVar11;
              goto LAB_00666b1f;
            }
LAB_0066738c:
            pcVar18 = "BCJ2 conversion Failed";
          }
          else {
LAB_00666b35:
            uVar14 = zip->codec;
            local_98 = uVar32;
            if ((long)uVar14 < 0x30401) {
              if (uVar14 == 0) {
                uVar32 = sVar27;
                if (uVar34 < sVar27) {
                  uVar32 = uVar34;
                }
                memcpy(puVar10,__src,uVar32);
                sVar35 = uVar34 - uVar32;
                sVar27 = sVar27 - uVar32;
                uVar32 = (ulong)(local_98 == 0);
              }
              else {
                if ((uVar14 != 0x21) && (uVar14 != 0x30101)) goto LAB_00667395;
                (zip->lzstream).next_in = __src;
                (zip->lzstream).avail_in = uVar34;
                (zip->lzstream).next_out = puVar10;
                (zip->lzstream).avail_out = sVar27;
                lVar6 = lzma_code(local_a0,LZMA_RUN);
                uVar32 = CONCAT44(extraout_var,lVar6);
                if (lVar6 != LZMA_OK) {
                  if (lVar6 != LZMA_STREAM_END) {
                    pcVar18 = "Decompression failed(%d)";
                    goto LAB_006673d6;
                  }
                  lzma_end(local_a0);
                  zip->lzstream_valid = 0;
                }
                sVar35 = (zip->lzstream).avail_in;
                sVar27 = (zip->lzstream).avail_out;
              }
LAB_00666daf:
              uVar25 = uVar33 - sVar27;
              uVar9 = (uint)uVar32;
              if (zip->codec == 0x21) {
LAB_0066713f:
                uVar14 = zip->codec2;
              }
              else {
                uVar14 = zip->codec2;
                if (uVar14 == 0x3030103) {
                  if (uVar25 < 5) {
                    uVar32 = 0;
                  }
                  else {
                    puVar10 = (uchar *)zip->bcj_prevPosT;
                    uVar28 = zip->bcj_prevMask;
                    uVar30 = (ulong)uVar28;
                    puVar31 = puVar21 + (uVar25 - 4);
                    puVar19 = puVar21;
                    if (puVar21 < puVar31) {
                      local_70 = -(long)puVar21;
                      uVar20 = (uint)puVar21;
                      local_ac = uVar20 - zip->bcj_ip;
                      local_b0 = (uVar20 - zip->bcj_ip) + -1;
                      local_78 = (ulong)~uVar20;
                      puVar5 = puVar21;
                      do {
                        puVar19 = puVar5;
                        uVar28 = (uint)uVar30;
                        lVar23 = 0;
                        while ((puVar19[lVar23] & 0xfe) != 0xe8) {
                          lVar3 = lVar23 + 1;
                          lVar23 = lVar23 + 1;
                          if (puVar31 <= puVar19 + lVar3) {
                            puVar19 = puVar19 + lVar23;
                            goto LAB_006670b7;
                          }
                        }
                        lVar3 = local_70 + (long)puVar19;
                        uVar30 = 0;
                        if ((ulong)((lVar3 - (long)puVar10) + lVar23) < 4) {
                          uVar28 = uVar28 << ((char)lVar23 +
                                              (((char)~uVar20 + (char)puVar19) - (char)puVar10) &
                                             0x1fU);
                          uVar29 = uVar28 & 7;
                          if (uVar29 == 0) goto LAB_00666edf;
                          if (((0xe8U >> uVar29 & 1) == 0) &&
                             ((byte)(puVar19[lVar23 + (4 - (ulong)*(byte *)((long)&
                                                  x86_Convert_kMaskToBitNumber + (ulong)uVar29))] -
                                    1) < 0xfe)) {
                            uVar30 = (ulong)uVar29;
                            goto LAB_00666edf;
                          }
LAB_00666fd2:
                          uVar30 = (ulong)((uVar28 & 3) * 2 + 1);
                          lVar16 = 1;
                        }
                        else {
LAB_00666edf:
                          bVar4 = puVar19[lVar23 + 4];
                          uVar28 = (uint)uVar30;
                          if ((bVar4 != 0xff) && (bVar4 != 0)) goto LAB_00666fd2;
                          uVar15 = ((ulong)(uint)(local_ac - (int)puVar19) +
                                   (ulong)((uint)puVar19[lVar23 + 1] |
                                          (uint)puVar19[lVar23 + 2] << 8 |
                                          (uint)puVar19[lVar23 + 3] << 0x10 | (uint)bVar4 << 0x18))
                                   - lVar23;
                          uVar29 = (uint)uVar15;
                          if (uVar28 != 0) {
                            while( true ) {
                              uVar29 = (uint)uVar15;
                              uVar28 = uVar29 >> (*(char *)((long)&x86_Convert_kMaskToBitNumber +
                                                           uVar30) * -8 + 0x18U & 0x1f);
                              if (((char)uVar28 != -1) &&
                                 (local_88 = lVar3, local_80 = uVar32, (uVar28 & 0xff) != 0)) break;
                              uVar15 = (ulong)(((local_b0 - (int)puVar19) - (int)lVar23) -
                                              (uVar29 ^ -1 << (*(char *)((long)&
                                                  x86_Convert_kMaskToBitNumber + uVar30) * -8 &
                                                  0x1fU)));
                            }
                          }
                          puVar19[lVar23 + 4] = (uchar)((int)(uVar29 << 7) >> 0x1f);
                          puVar19[lVar23 + 3] = (uchar)(uVar29 >> 0x10);
                          puVar19[lVar23 + 2] = (uchar)(uVar29 >> 8);
                          puVar19[lVar23 + 1] = (uchar)uVar29;
                          lVar16 = 5;
                        }
                        uVar28 = (uint)uVar30;
                        puVar10 = (uchar *)(lVar3 + lVar23);
                        puVar5 = puVar19 + lVar16 + lVar23;
                      } while (puVar19 + lVar16 + lVar23 < puVar31);
                      puVar10 = puVar19 + (lVar23 - (long)puVar21);
                      puVar19 = puVar19 + lVar23 + lVar16;
                    }
LAB_006670b7:
                    uVar32 = (long)puVar19 - (long)puVar21;
                    zip->bcj_prevPosT = (size_t)puVar10;
                    zip->bcj_prevMask = uVar28;
                    zip->bcj_ip = zip->bcj_ip + (int)uVar32;
                  }
                  sVar17 = uVar25 - uVar32;
                  zip->odd_bcj_size = sVar17;
                  if ((((sVar17 == 0) || (uVar9 == 1)) || (4 < sVar17)) || (local_98 == 0)) {
                    zip->odd_bcj_size = 0;
                  }
                  else {
                    memcpy(local_68,puVar21 + uVar32,sVar17);
                    uVar25 = uVar32;
                  }
                  goto LAB_0066713f;
                }
              }
              if (uVar14 == 0x303011b) {
                uVar32 = zip->tmp_stream_buff_size - sVar27;
                if (zip->main_stream_bytes_remaining <= uVar32) {
                  uVar32 = zip->main_stream_bytes_remaining;
                }
                zip->tmp_stream_bytes_avail = uVar32;
                zip->tmp_stream_bytes_remaining = uVar32;
                sVar11 = Bcj2_Decode(zip,puVar24,sVar22);
                if (sVar11 < 0) goto LAB_0066738c;
                zip->main_stream_bytes_remaining =
                     zip->main_stream_bytes_remaining +
                     (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
                uVar25 = (uVar33 - sVar22) + sVar11;
              }
              if (1 < uVar9) {
                return -0x1e;
              }
              sVar35 = uVar34 - sVar35;
              goto LAB_006671d5;
            }
            if (uVar14 == 0x30401) {
              if (((zip->ppmd7_valid == 0) || (iVar7 = zip->ppmd7_stat, iVar7 < 0)) || (sVar27 == 0)
                 ) {
LAB_00667395:
                pcVar18 = "Decompression internal error";
                goto LAB_006673a1;
              }
              (zip->ppstream).next_in = __src;
              (zip->ppstream).avail_in = uVar34;
              (zip->ppstream).next_out = puVar10;
              (zip->ppstream).avail_out = sVar27;
              if (iVar7 == 0) {
                (zip->bytein).a = a;
                (zip->bytein).Read = ppmd_read;
                (zip->range_dec).Stream = local_58;
                BVar8 = (*local_60)(local_90);
                if (BVar8 == 0) {
                  zip->ppmd7_stat = -1;
                  pcVar18 = "Failed to initialize PPMd range decoder";
                  goto LAB_006673a1;
                }
                if ((zip->ppstream).overconsumed != 0) {
LAB_00667363:
                  zip->ppmd7_stat = -1;
                  return -0x1e;
                }
                zip->ppmd7_stat = 1;
              }
              if (uVar32 == 0) {
                uVar25 = zip->folder_outbytes_remaining;
              }
              else {
                uVar25 = 0;
              }
              do {
                uVar30 = uVar25;
                iVar7 = (*local_38)(local_40,&local_90->p);
                if (iVar7 < 0) {
                  zip->ppmd7_stat = -1;
                  pcVar18 = "Failed to decode PPMd";
                  goto LAB_006672f5;
                }
                if ((zip->ppstream).overconsumed != 0) goto LAB_00667363;
                puVar10 = (zip->ppstream).next_out;
                (zip->ppstream).next_out = puVar10 + 1;
                *puVar10 = (uchar)iVar7;
                sVar27 = (zip->ppstream).avail_out - 1;
                (zip->ppstream).avail_out = sVar27;
                (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
                sVar35 = (zip->ppstream).avail_in;
                uVar32 = 0;
                if (sVar27 == 0) {
                  sVar27 = 0;
                  break;
                }
                uVar25 = uVar30 - 1;
                if (uVar30 == 0) {
                  uVar25 = uVar32;
                }
              } while ((sVar35 != 0) || (sVar35 = 0, 1 < uVar30));
              goto LAB_00666daf;
            }
            if (uVar14 == 0x40108) {
              (zip->stream).next_in = __src;
              (zip->stream).avail_in = (uint)uVar34;
              (zip->stream).next_out = puVar10;
              (zip->stream).avail_out = (uint)sVar27;
              uVar9 = cm_zlib_inflate(local_50,0);
              uVar32 = CONCAT44(extraout_var_01,uVar9);
              if (1 < uVar9) {
                pcVar18 = "File decompression failed (%d)";
LAB_006673d6:
                archive_set_error(&a->archive,-1,pcVar18,uVar32 & 0xffffffff);
                return -0x1e;
              }
              sVar35 = (size_t)(zip->stream).avail_in;
              sVar27 = (size_t)(zip->stream).avail_out;
              goto LAB_00666daf;
            }
            if (uVar14 != 0x40202) goto LAB_00667395;
            (zip->bzstream).next_in = (char *)__src;
            (zip->bzstream).avail_in = (uint)uVar34;
            (zip->bzstream).next_out = (char *)puVar10;
            (zip->bzstream).avail_out = (uint)sVar27;
            iVar7 = BZ2_bzDecompress(local_a8);
            uVar32 = CONCAT44(extraout_var_00,iVar7);
            if (iVar7 == 0) {
LAB_00666c4a:
              sVar35 = (size_t)(zip->bzstream).avail_in;
              sVar27 = (size_t)(zip->bzstream).avail_out;
              goto LAB_00666daf;
            }
            if (iVar7 == 4) {
              iVar7 = BZ2_bzDecompressEnd(local_a8);
              if (iVar7 == 0) {
                zip->bzstream_valid = 0;
                uVar32 = 1;
                goto LAB_00666c4a;
              }
              pcVar18 = "Failed to clean up decompressor";
            }
            else {
              pcVar18 = "bzip decompression failed";
            }
          }
LAB_006673a1:
          iVar7 = -1;
          goto LAB_006673a6;
        }
        if (uVar33 < 5 && uVar32 != 0) {
          if (zip->odd_bcj_size == 0) goto LAB_00666a80;
          uVar26 = zip->folder_outbytes_remaining;
          bVar37 = false;
          sVar35 = 0;
          bVar36 = false;
          uVar25 = 0;
        }
        else {
          if (uVar33 != 0 && zip->odd_bcj_size != 0) {
            lVar23 = 0;
            do {
              puVar21[lVar23] = zip->odd_bcj[lVar23];
              lVar3 = lVar23 + 1;
              psVar1 = &zip->odd_bcj_size;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) break;
              bVar37 = uVar33 - 1 != lVar23;
              lVar23 = lVar3;
            } while (bVar37);
            puVar24 = puVar21 + lVar3;
            sVar27 = uVar33 - lVar3;
          }
LAB_00666a80:
          if ((uVar32 != 0) && (sVar27 != 0)) {
            uVar14 = zip->codec2;
            goto LAB_00666a99;
          }
          uVar9 = (uint)(uVar32 == 0);
          uVar25 = uVar33 - sVar27;
LAB_00666c7a:
          sVar35 = 0;
LAB_006671d5:
          uVar26 = zip->folder_outbytes_remaining;
          if (uVar26 <= uVar25) {
            uVar25 = uVar26;
          }
          bVar36 = uVar9 != 0;
          puVar2 = &zip->pack_stream_inbytes_remaining;
          *puVar2 = *puVar2 - sVar35;
          bVar37 = *puVar2 == 0;
          sVar22 = zip->uncompressed_buffer_size;
          sVar12 = zip->uncompressed_buffer_bytes_remaining;
        }
        zip->folder_outbytes_remaining = uVar26 - uVar25;
        uVar32 = sVar12 + uVar25;
        zip->uncompressed_buffer_bytes_remaining = uVar32;
        zip->pack_stream_bytes_unconsumed = sVar35;
        if (((uVar32 == sVar22) ||
            ((zip->codec2 == 0x3030103 && (sVar22 < uVar32 + 5 && zip->odd_bcj_size != 0)))) ||
           ((bool)(bVar37 & uVar26 == uVar25))) {
          if (local_48 <= uVar32) {
            zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
            return 0;
          }
LAB_00667309:
          pcVar18 = "Damaged 7-Zip archive";
          goto LAB_006673a1;
        }
        if ((bool)(bVar36 | (uVar25 == 0 && sVar35 == 0))) goto LAB_00667309;
        read_consume(a);
        __src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_b8);
      } while (0 < (long)local_b8);
    }
  }
  pcVar18 = "Truncated 7-Zip file body";
LAB_006672f5:
  iVar7 = 0x54;
LAB_006673a6:
  archive_set_error(&a->archive,iVar7,pcVar18);
  return -0x1e;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if ((uint64_t)bytes_avail > zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if ((uint64_t)bytes_avail > zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}